

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O2

int read_StreamsInfo(archive_read *a,_7z_stream_info *si)

{
  _7z_coders_info *val;
  ulong *puVar1;
  byte bVar2;
  void *pvVar3;
  _7z_folder *p_Var4;
  int iVar5;
  uchar *puVar6;
  uint64_t *puVar7;
  uint64_t *puVar8;
  _7z_folder *p_Var9;
  _7z_coder *p_Var10;
  byte *pbVar11;
  uchar *__dest;
  anon_struct_16_2_4d417c8e *paVar12;
  uint64_t *puVar13;
  uint32_t *puVar14;
  uint64_t uVar15;
  uint uVar16;
  unsigned_long id;
  ulong uVar17;
  uint i;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  uchar uVar21;
  ulong uVar22;
  size_t sVar23;
  ulong uVar24;
  uint uVar25;
  long lVar27;
  bool bVar28;
  _7z_digests local_68;
  ulong local_50;
  uint64_t local_48;
  ulong local_40;
  void *local_38;
  uint uVar26;
  
  pvVar3 = a->format->data;
  (si->ss).unpackSizes = (uint64_t *)0x0;
  (si->ss).digestsDefined = (uchar *)0x0;
  (si->ci).dataStreamIndex = 0;
  (si->ss).unpack_streams = 0;
  (si->ci).numFolders = 0;
  (si->ci).folders = (_7z_folder *)0x0;
  (si->pi).digest.digests = (uint32_t *)0x0;
  (si->pi).positions = (uint64_t *)0x0;
  (si->pi).sizes = (uint64_t *)0x0;
  (si->pi).digest.defineds = (uchar *)0x0;
  (si->pi).pos = 0;
  (si->pi).numPackStreams = 0;
  (si->ss).digests = (uint32_t *)0x0;
  puVar6 = header_bytes(a,1);
  if (puVar6 == (uchar *)0x0) {
    return -1;
  }
  uVar21 = *puVar6;
  if (uVar21 == '\x06') {
    (si->pi).digest.digests = (uint32_t *)0x0;
    (si->pi).positions = (uint64_t *)0x0;
    (si->pi).sizes = (uint64_t *)0x0;
    (si->pi).digest.defineds = (uchar *)0x0;
    (si->pi).pos = 0;
    (si->pi).numPackStreams = 0;
    iVar5 = parse_7zip_uint64(a,(uint64_t *)si);
    if (iVar5 < 0) {
      return -1;
    }
    puVar13 = &(si->pi).numPackStreams;
    iVar5 = parse_7zip_uint64(a,puVar13);
    if (iVar5 < 0) {
      return -1;
    }
    if (*puVar13 - 0x5f5e101 < 0xfffffffffa0a1f00) {
      return -1;
    }
    puVar6 = header_bytes(a,1);
    if (puVar6 == (uchar *)0x0) {
      return -1;
    }
    if (*puVar6 != '\0') {
      if (*puVar6 != '\t') {
        return -1;
      }
      sVar23 = (si->pi).numPackStreams;
      puVar7 = (uint64_t *)calloc(sVar23,8);
      (si->pi).sizes = puVar7;
      puVar8 = (uint64_t *)calloc(sVar23,8);
      (si->pi).positions = puVar8;
      if (puVar8 == (uint64_t *)0x0 || puVar7 == (uint64_t *)0x0) {
        return -1;
      }
      uVar16 = 0;
      while ((ulong)uVar16 < *puVar13) {
        iVar5 = parse_7zip_uint64(a,(si->pi).sizes + uVar16);
        uVar16 = uVar16 + 1;
        if (iVar5 < 0) {
          return -1;
        }
      }
      puVar6 = header_bytes(a,1);
      if (puVar6 == (uchar *)0x0) {
        return -1;
      }
      if (*puVar6 == '\0') {
        sVar23 = (si->pi).numPackStreams;
        puVar6 = (uchar *)calloc(sVar23,1);
        (si->pi).digest.defineds = puVar6;
        puVar14 = (uint32_t *)calloc(sVar23,4);
        (si->pi).digest.digests = puVar14;
        if (puVar14 == (uint32_t *)0x0 || puVar6 == (uchar *)0x0) {
          return -1;
        }
      }
      else {
        if (*puVar6 != '\n') {
          return -1;
        }
        iVar5 = read_Digests(a,&(si->pi).digest,(si->pi).numPackStreams);
        if (iVar5 < 0) {
          return -1;
        }
        puVar6 = header_bytes(a,1);
        if (puVar6 == (uchar *)0x0) {
          return -1;
        }
        if (*puVar6 != '\0') {
          return -1;
        }
      }
    }
    puVar7 = (si->pi).positions;
    if (puVar7 == (uint64_t *)0x0) {
      return -1;
    }
    puVar8 = (si->pi).sizes;
    if (puVar8 == (uint64_t *)0x0) {
      return -1;
    }
    uVar18 = (si->pi).pos;
    uVar16 = 0;
    while (uVar20 = (ulong)uVar16, uVar20 < *puVar13) {
      puVar7[uVar20] = uVar18;
      puVar1 = puVar8 + uVar20;
      bVar28 = CARRY8(uVar18,*puVar1);
      uVar18 = uVar18 + *puVar1;
      if (bVar28) {
        return -1;
      }
      uVar16 = uVar16 + 1;
      if (*(ulong *)((long)pvVar3 + 0x80) < uVar18) {
        return -1;
      }
    }
    puVar6 = header_bytes(a,1);
    if (puVar6 == (uchar *)0x0) {
      return -1;
    }
    uVar21 = *puVar6;
  }
  if (uVar21 != '\a') goto LAB_0022cc74;
  (si->ci).numFolders = 0;
  (si->ci).folders = (_7z_folder *)0x0;
  (si->ci).dataStreamIndex = 0;
  local_68.defineds = (uchar *)0x0;
  local_68.digests = (uint32_t *)0x0;
  puVar6 = header_bytes(a,1);
  if ((puVar6 == (uchar *)0x0) || (*puVar6 != '\v')) goto LAB_0022cadd;
  val = &si->ci;
  iVar5 = parse_7zip_uint64(a,&val->numFolders);
  if (iVar5 < 0) goto LAB_0022cadd;
  if (100000000 < val->numFolders) {
    return -1;
  }
  puVar6 = header_bytes(a,1);
  if (puVar6 == (uchar *)0x0) goto LAB_0022cadd;
  if (*puVar6 == '\x01') {
    puVar13 = &(si->ci).dataStreamIndex;
    iVar5 = parse_7zip_uint64(a,puVar13);
    if (iVar5 < 0) {
      return -1;
    }
    if (100000000 < *puVar13) {
      return -1;
    }
    if (val->numFolders != 0) goto LAB_0022cacc;
  }
  else {
    if (*puVar6 != '\0') {
LAB_0022cacc:
      archive_set_error(&a->archive,-1,"Malformed 7-Zip archive");
      goto LAB_0022cadd;
    }
    sVar23 = (si->ci).numFolders;
    p_Var9 = (_7z_folder *)calloc(sVar23,0x68);
    (si->ci).folders = p_Var9;
    if (p_Var9 == (_7z_folder *)0x0) {
      return -1;
    }
    uVar16 = 0;
    while (uVar18 = (ulong)uVar16, uVar18 < sVar23) {
      p_Var4 = (si->ci).folders;
      p_Var9 = p_Var4 + uVar18;
      local_38 = a->format->data;
      p_Var4[uVar18].numUnpackStreams = 0;
      (&p_Var4[uVar18].numUnpackStreams)[1] = 0;
      p_Var4[uVar18].unPackSize = (uint64_t *)0x0;
      (&p_Var4[uVar18].unPackSize)[1] = (uint64_t *)0x0;
      p_Var4[uVar18].numInStreams = 0;
      (&p_Var4[uVar18].numInStreams)[1] = 0;
      p_Var4[uVar18].numPackedStreams = 0;
      (&p_Var4[uVar18].numPackedStreams)[1] = 0;
      p_Var4[uVar18].numBindPairs = 0;
      (&p_Var4[uVar18].numBindPairs)[1] = 0;
      p_Var4[uVar18].numCoders = 0;
      p_Var4[uVar18].coders = (_7z_coder *)0x0;
      p_Var4[uVar18].skipped_bytes = 0;
      local_40 = uVar18;
      iVar5 = parse_7zip_uint64(a,&p_Var9->numCoders);
      if ((iVar5 < 0) || (uVar18 = p_Var9->numCoders, 4 < uVar18)) goto LAB_0022cadd;
      p_Var10 = (_7z_coder *)calloc(uVar18,0x28);
      p_Var9->coders = p_Var10;
      if (p_Var10 == (_7z_coder *)0x0) goto LAB_0022cadd;
      local_48 = 0;
      uVar20 = 0;
      uVar16 = 0;
      while (uVar16 < uVar18) {
        local_50 = (ulong)uVar16;
        pbVar11 = header_bytes(a,1);
        if ((pbVar11 == (byte *)0x0) || (bVar2 = *pbVar11, (char)bVar2 < '\0')) goto LAB_0022cadd;
        puVar6 = header_bytes(a,(ulong)(bVar2 & 0xf));
        uVar18 = local_50;
        if (puVar6 == (uchar *)0x0) goto LAB_0022cadd;
        uVar17 = 0;
        for (uVar19 = 0; (bVar2 & 0xf) != uVar19; uVar19 = uVar19 + 1) {
          uVar17 = uVar17 << 8 | (ulong)puVar6[uVar19];
        }
        p_Var10 = p_Var9->coders;
        puVar13 = &p_Var10[local_50].numInStreams;
        p_Var10[local_50].codec = uVar17;
        if ((bVar2 & 0x10) == 0) {
          *puVar13 = 1;
          p_Var10[local_50].numOutStreams = 1;
        }
        else {
          iVar5 = parse_7zip_uint64(a,puVar13);
          if ((((iVar5 < 0) || (100000000 < p_Var9->coders[uVar18].numInStreams)) ||
              (iVar5 = parse_7zip_uint64(a,&p_Var9->coders[uVar18].numOutStreams), iVar5 < 0)) ||
             (p_Var10 = p_Var9->coders, 100000000 < p_Var10[uVar18].numOutStreams))
          goto LAB_0022cadd;
        }
        if ((bVar2 & 0x20) != 0) {
          iVar5 = parse_7zip_uint64(a,&p_Var10[uVar18].propertiesSize);
          if (((iVar5 < 0) || (uVar17 = p_Var9->coders[uVar18].propertiesSize, 100000000 < uVar17))
             || (puVar6 = header_bytes(a,uVar17), puVar6 == (uchar *)0x0)) goto LAB_0022cadd;
          p_Var10 = p_Var9->coders;
          sVar23 = p_Var10[uVar18].propertiesSize;
          __dest = (uchar *)malloc(sVar23);
          p_Var10[uVar18].properties = __dest;
          if (__dest == (uchar *)0x0) goto LAB_0022cadd;
          memcpy(__dest,puVar6,sVar23);
        }
        uVar20 = uVar20 + p_Var10[uVar18].numInStreams;
        local_48 = local_48 + p_Var10[uVar18].numOutStreams;
        uVar18 = p_Var9->numCoders;
        uVar16 = (int)local_50 + 1;
      }
      if (((local_48 == 0) || (sVar23 = local_48 - 1, uVar20 < sVar23)) ||
         (p_Var9->numBindPairs = sVar23, *(ulong *)((long)local_38 + 0x70) < sVar23))
      goto LAB_0022cadd;
      if (sVar23 == 0) {
        p_Var9->bindPairs = (anon_struct_16_2_4d417c8e *)0x0;
        paVar12 = (anon_struct_16_2_4d417c8e *)0x0;
      }
      else {
        paVar12 = (anon_struct_16_2_4d417c8e *)calloc(sVar23,0x10);
        p_Var9->bindPairs = paVar12;
        if (paVar12 == (anon_struct_16_2_4d417c8e *)0x0) goto LAB_0022cadd;
      }
      uVar16 = 0;
      while( true ) {
        uVar17 = (ulong)uVar16;
        uVar18 = p_Var9->numBindPairs;
        if (uVar18 <= uVar17) break;
        iVar5 = parse_7zip_uint64(a,&paVar12[uVar17].inIndex);
        if (((iVar5 < 0) || (100000000 < p_Var9->bindPairs[uVar17].inIndex)) ||
           (iVar5 = parse_7zip_uint64(a,&p_Var9->bindPairs[uVar17].outIndex), iVar5 < 0))
        goto LAB_0022cadd;
        paVar12 = p_Var9->bindPairs;
        uVar16 = uVar16 + 1;
        if (100000000 < paVar12[uVar17].outIndex) goto LAB_0022cadd;
      }
      sVar23 = uVar20 - uVar18;
      p_Var9->numPackedStreams = sVar23;
      puVar13 = (uint64_t *)calloc(sVar23,8);
      p_Var9->packedStreams = puVar13;
      if (puVar13 == (uint64_t *)0x0) goto LAB_0022cadd;
      if (sVar23 == 1) {
        uVar17 = 0;
        do {
          uVar19 = uVar17;
          if (uVar20 <= uVar19) break;
          uVar17 = 0;
          do {
            uVar24 = uVar17;
            if (uVar18 <= uVar24) break;
            uVar17 = (ulong)((int)uVar24 + 1);
          } while (paVar12[uVar24].inIndex != uVar19);
          uVar17 = (ulong)((int)uVar19 + 1);
        } while (uVar18 != uVar24);
        if (uVar20 == uVar19) goto LAB_0022cadd;
        *puVar13 = uVar19;
      }
      else {
        uVar16 = 0;
        while (uVar18 = (ulong)uVar16, uVar18 < p_Var9->numPackedStreams) {
          iVar5 = parse_7zip_uint64(a,puVar13 + uVar18);
          if (iVar5 < 0) goto LAB_0022cadd;
          puVar13 = p_Var9->packedStreams;
          uVar16 = uVar16 + 1;
          if (100000000 < puVar13[uVar18]) goto LAB_0022cadd;
        }
      }
      p_Var9->numInStreams = uVar20;
      p_Var9->numOutStreams = local_48;
      sVar23 = val->numFolders;
      uVar16 = (int)local_40 + 1;
    }
  }
  puVar6 = header_bytes(a,1);
  if ((puVar6 != (uchar *)0x0) && (*puVar6 == '\f')) {
    for (uVar16 = 0; uVar18 = (ulong)uVar16, uVar18 < val->numFolders; uVar16 = uVar16 + 1) {
      p_Var9 = (si->ci).folders;
      puVar13 = (uint64_t *)calloc(p_Var9[uVar18].numOutStreams,8);
      p_Var9[uVar18].unPackSize = puVar13;
      if (puVar13 == (uint64_t *)0x0) goto LAB_0022cadd;
      uVar20 = 0;
      while (uVar20 < p_Var9[uVar18].numOutStreams) {
        iVar5 = parse_7zip_uint64(a,p_Var9[uVar18].unPackSize + uVar20);
        uVar20 = (ulong)((int)uVar20 + 1);
        if (iVar5 < 0) goto LAB_0022cadd;
      }
    }
    puVar6 = header_bytes(a,1);
    if (puVar6 != (uchar *)0x0) {
      if (*puVar6 == '\n') {
        iVar5 = read_Digests(a,&local_68,val->numFolders);
        if (iVar5 < 0) goto LAB_0022cadd;
        uVar18 = val->numFolders;
        for (uVar16 = 0; uVar20 = (ulong)uVar16, uVar20 < uVar18; uVar16 = uVar16 + 1) {
          p_Var9 = (si->ci).folders;
          p_Var9[uVar20].digest_defined = local_68.defineds[uVar20];
          p_Var9[uVar20].digest = local_68.digests[uVar20];
        }
        puVar6 = header_bytes(a,1);
        if ((puVar6 == (uchar *)0x0) || (*puVar6 != '\0')) goto LAB_0022cadd;
        free_Digest(&local_68);
      }
      else if (*puVar6 != '\0') goto LAB_0022cadd;
      uVar18 = (si->ci).numFolders;
      p_Var9 = (si->ci).folders;
      uVar16 = 0;
      uVar25 = 0;
      while (uVar20 = (ulong)uVar16, uVar20 < uVar18) {
        p_Var9[uVar20].packIndex = uVar25;
        uVar20 = p_Var9[uVar20].numPackedStreams;
        if (uVar20 >> 0x20 != 0) {
          return -1;
        }
        uVar26 = (uint)uVar20;
        bVar28 = CARRY4(uVar26,uVar25);
        uVar25 = uVar26 + uVar25;
        if (bVar28) {
          return -1;
        }
        uVar16 = uVar16 + 1;
        if ((si->pi).numPackStreams < (ulong)uVar25) {
          return -1;
        }
      }
      puVar6 = header_bytes(a,1);
      if (puVar6 == (uchar *)0x0) {
        return -1;
      }
      uVar21 = *puVar6;
LAB_0022cc74:
      if (uVar21 == '\b') {
        uVar18 = (si->ci).numFolders;
        p_Var9 = (si->ci).folders;
        (si->ss).unpack_streams = 0;
        (si->ss).unpackSizes = (uint64_t *)0x0;
        (si->ss).digestsDefined = (uchar *)0x0;
        (si->ss).digests = (uint32_t *)0x0;
        for (uVar16 = 0; uVar16 < uVar18; uVar16 = uVar16 + 1) {
          p_Var9[uVar16].numUnpackStreams = 1;
        }
        puVar6 = header_bytes(a,1);
        if (puVar6 == (uchar *)0x0) {
          return -1;
        }
        uVar21 = *puVar6;
        uVar20 = uVar18;
        if (uVar21 == '\r') {
          puVar13 = &p_Var9->numUnpackStreams;
          uVar20 = 0;
          uVar17 = uVar18;
          while (bVar28 = uVar17 != 0, uVar17 = uVar17 - 1, bVar28) {
            iVar5 = parse_7zip_uint64(a,puVar13);
            if (iVar5 < 0) {
              return -1;
            }
            if (100000000 < *puVar13) {
              return -1;
            }
            if (0xfffffffffa0a1eff < uVar20) {
              return -1;
            }
            uVar20 = uVar20 + *puVar13;
            puVar13 = puVar13 + 0xd;
          }
          puVar6 = header_bytes(a,1);
          if (puVar6 == (uchar *)0x0) {
            return -1;
          }
          uVar21 = *puVar6;
        }
        (si->ss).unpack_streams = uVar20;
        if (uVar20 == 0) {
          puVar13 = (si->ss).unpackSizes;
        }
        else {
          puVar13 = (uint64_t *)calloc(uVar20,8);
          (si->ss).unpackSizes = puVar13;
          puVar6 = (uchar *)calloc(uVar20,1);
          (si->ss).digestsDefined = puVar6;
          puVar14 = (uint32_t *)calloc(uVar20,4);
          (si->ss).digests = puVar14;
          if ((puVar13 == (uint64_t *)0x0) || (puVar14 == (uint32_t *)0x0 || puVar6 == (uchar *)0x0)
             ) {
            return -1;
          }
        }
        for (uVar16 = 0; uVar17 = (ulong)uVar16, uVar17 < uVar18; uVar16 = uVar16 + 1) {
          uVar19 = p_Var9[uVar17].numUnpackStreams;
          if (uVar19 != 0) {
            local_50 = uVar17;
            if (uVar21 == '\t') {
              uVar24 = 0;
              for (uVar22 = 1; uVar22 < uVar19; uVar22 = (ulong)((int)uVar22 + 1)) {
                iVar5 = parse_7zip_uint64(a,puVar13);
                if (iVar5 < 0) {
                  return -1;
                }
                bVar28 = CARRY8(uVar24,*puVar13);
                uVar24 = uVar24 + *puVar13;
                if (bVar28) {
                  return -1;
                }
                puVar13 = puVar13 + 1;
                uVar19 = p_Var9[uVar17].numUnpackStreams;
              }
            }
            else {
              uVar24 = 0;
            }
            uVar15 = folder_uncompressed_size(p_Var9 + uVar17);
            if (uVar15 < uVar24) {
              return -1;
            }
            *puVar13 = uVar15 - uVar24;
            puVar13 = puVar13 + 1;
            uVar16 = (uint)local_50;
          }
        }
        if (uVar21 == '\t') {
          puVar6 = header_bytes(a,1);
          if (puVar6 == (uchar *)0x0) {
            return -1;
          }
          uVar21 = *puVar6;
        }
        for (uVar16 = 0; uVar17 = (ulong)uVar16, uVar17 < uVar20; uVar16 = uVar16 + 1) {
          (si->ss).digestsDefined[uVar17] = '\0';
          (si->ss).digests[uVar17] = 0;
        }
        uVar16 = 0;
        for (uVar25 = 0; uVar20 = (ulong)uVar25, uVar20 < uVar18; uVar25 = uVar25 + 1) {
          if ((p_Var9[uVar20].numUnpackStreams != 1) || (p_Var9[uVar20].digest_defined == '\0')) {
            uVar16 = uVar16 + (int)p_Var9[uVar20].numUnpackStreams;
          }
        }
        if (uVar21 == '\n') {
          puVar6 = (si->ss).digestsDefined;
          puVar14 = (si->ss).digests;
          local_68.defineds = (uchar *)0x0;
          local_68.digests = (uint32_t *)0x0;
          iVar5 = read_Digests(a,&local_68,(ulong)uVar16);
          if (iVar5 < 0) {
            free_Digest(&local_68);
            return -1;
          }
          iVar5 = 0;
          for (uVar20 = 0; uVar20 != uVar18; uVar20 = uVar20 + 1) {
            uVar15 = p_Var9[uVar20].numUnpackStreams;
            if ((uVar15 == 1) && (p_Var9[uVar20].digest_defined != '\0')) {
              *puVar6 = '\x01';
              puVar6 = puVar6 + 1;
              *puVar14 = p_Var9[uVar20].digest;
              puVar14 = puVar14 + 1;
            }
            else {
              lVar27 = (long)iVar5;
              for (uVar16 = 0; uVar16 < uVar15; uVar16 = uVar16 + 1) {
                *puVar6 = local_68.defineds[lVar27];
                puVar6 = puVar6 + 1;
                *puVar14 = local_68.digests[lVar27];
                puVar14 = puVar14 + 1;
                lVar27 = lVar27 + 1;
                uVar15 = p_Var9[uVar20].numUnpackStreams;
              }
              iVar5 = iVar5 + uVar16;
            }
          }
          free_Digest(&local_68);
          puVar6 = header_bytes(a,1);
          if (puVar6 == (uchar *)0x0) {
            return -1;
          }
          uVar21 = *puVar6;
        }
        if (uVar21 != '\0') {
          return -1;
        }
        puVar6 = header_bytes(a,1);
        if (puVar6 == (uchar *)0x0) {
          return -1;
        }
        uVar21 = *puVar6;
      }
      return -(uint)(uVar21 != '\0');
    }
  }
LAB_0022cadd:
  free_Digest(&local_68);
  return -1;
}

Assistant:

static int
read_StreamsInfo(struct archive_read *a, struct _7z_stream_info *si)
{
	struct _7zip *zip = (struct _7zip *)a->format->data;
	const unsigned char *p;
	unsigned i;

	memset(si, 0, sizeof(*si));

	if ((p = header_bytes(a, 1)) == NULL)
		return (-1);
	if (*p == kPackInfo) {
		uint64_t packPos;

		if (read_PackInfo(a, &(si->pi)) < 0)
			return (-1);

		if (si->pi.positions == NULL || si->pi.sizes == NULL)
			return (-1);
		/*
		 * Calculate packed stream positions.
		 */
		packPos = si->pi.pos;
		for (i = 0; i < si->pi.numPackStreams; i++) {
			si->pi.positions[i] = packPos;
			if (packPos > UINT64_MAX - si->pi.sizes[i])
				return (-1);
			packPos += si->pi.sizes[i];
			if (packPos > zip->header_offset)
				return (-1);
		}
		if ((p = header_bytes(a, 1)) == NULL)
			return (-1);
	}
	if (*p == kUnPackInfo) {
		uint32_t packIndex;
		struct _7z_folder *f;

		if (read_CodersInfo(a, &(si->ci)) < 0)
			return (-1);

		/*
		 * Calculate packed stream indexes.
		 */
		packIndex = 0;
		f = si->ci.folders;
		for (i = 0; i < si->ci.numFolders; i++) {
			f[i].packIndex = packIndex;
			if (f[i].numPackedStreams > UINT32_MAX)
				return (-1);
			if (packIndex > UINT32_MAX - (uint32_t)f[i].numPackedStreams)
				return (-1);
			packIndex += (uint32_t)f[i].numPackedStreams;
			if (packIndex > si->pi.numPackStreams)
				return (-1);
		}
		if ((p = header_bytes(a, 1)) == NULL)
			return (-1);
	}

	if (*p == kSubStreamsInfo) {
		if (read_SubStreamsInfo(a, &(si->ss),
		    si->ci.folders, (size_t)si->ci.numFolders) < 0)
			return (-1);
		if ((p = header_bytes(a, 1)) == NULL)
			return (-1);
	}

	/*
	 *  Must be kEnd.
	 */
	if (*p != kEnd)
		return (-1);
	return (0);
}